

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void unifyPathDelimiters(char *path,uint pathLength)

{
  char *pcVar1;
  
  if (pathLength != 0 && path != (char *)0x0) {
    pcVar1 = path + pathLength;
    do {
      if (*path == '\\') {
        *path = '/';
      }
      path = path + 1;
    } while (path < pcVar1);
  }
  return;
}

Assistant:

void unifyPathDelimiters(char * path, unsigned int pathLength)
{
    if (path == 0x0 || pathLength == 0)
    {
        return;
    }

    const char * end = path + pathLength;

    for (char * iter = path; iter < end; ++iter)
    {
        if (*iter == windowsPathDelim)
        {
            *iter = unixPathDelim;
        }
    }
}